

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

_Bool remove_single_send_data_condition_function
                (void *item,void *match_context,_Bool *continue_processing)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *item;
  lVar2 = *match_context;
  *continue_processing = lVar1 != lVar2;
  return lVar1 == lVar2;
}

Assistant:

static bool remove_single_send_data_condition_function(const void* item, const void* match_context, bool* continue_processing)
{
    SEND_CALLBACK_DATA* current_send_data = (SEND_CALLBACK_DATA*)item;
    SEND_CALLBACK_DATA* reference_send_data = (SEND_CALLBACK_DATA*)match_context;

    if (current_send_data->id == reference_send_data->id)
    {
        *continue_processing = false;
        return true;
    }
    else
    {
        *continue_processing = true;
        return false;
    }
}